

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ProcessJoin(Parse *pParse,Select *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ExprList *pList_00;
  Expr *pRight_00;
  Expr *pRight_01;
  Select *pSVar4;
  ExprList *local_a8;
  ExprList *pFuncArgs;
  Expr *pEq;
  Expr *pE2;
  Expr *pE1;
  int local_80;
  int iRightCol;
  int iLeftCol;
  int iLeft;
  char *zName_1;
  sqlite3 *db;
  IdList *pList;
  char *zName;
  IdList *pUsing;
  Table *pTStack_48;
  u32 joinType;
  Table *pRightTab;
  SrcItem *pRight;
  SrcItem *pLeft;
  int j;
  int i;
  SrcList *pSrc;
  Select *p_local;
  Parse *pParse_local;
  
  _j = p->pSrc;
  pRight = _j->a;
  pRightTab = (Table *)(_j + 1);
  pLeft._4_4_ = 0;
  pSrc = (SrcList *)p;
  p_local = (Select *)pParse;
  do {
    if (_j->nSrc + -1 <= pLeft._4_4_) {
      return 0;
    }
    pTStack_48 = (Table *)pRightTab->pCheck;
    if ((pRight->pTab != (Table *)0x0) && (pTStack_48 != (Table *)0x0)) {
      pUsing._4_4_ = 2;
      if ((pRightTab->szTabRow & 0x20) != 0) {
        pUsing._4_4_ = 1;
      }
      if ((pRightTab->szTabRow & 4) != 0) {
        zName = (char *)0x0;
        if (((*(ushort *)((long)&pRightTab->szTabRow + 1) >> 10 & 1) != 0) ||
           ((pRightTab->u).tab.pFKey != (FKey *)0x0)) {
          sqlite3ErrorMsg((Parse *)p_local,"a NATURAL join may not have an ON or USING clause",0);
          return 1;
        }
        for (pLeft._0_4_ = 0; (int)pLeft < pTStack_48->nCol; pLeft._0_4_ = (int)pLeft + 1) {
          if ((pTStack_48->aCol[(int)pLeft].colFlags & 2) == 0) {
            pList = (IdList *)pTStack_48->aCol[(int)pLeft].zCnName;
            iVar1 = tableAndColumnIndex(_j,0,pLeft._4_4_,(char *)pList,(int *)0x0,(int *)0x0,1);
            if ((iVar1 != 0) &&
               (zName = (char *)sqlite3IdListAppend((Parse *)p_local,(IdList *)zName,(Token *)0x0),
               (IdList *)zName != (IdList *)0x0)) {
              pcVar3 = sqlite3DbStrDup(*(sqlite3 **)p_local,(char *)pList);
              *(char **)(zName + (long)(*(int *)zName + -1) * 0x10 + 8) = pcVar3;
            }
          }
        }
        if (zName != (char *)0x0) {
          *(ushort *)((long)&pRightTab->szTabRow + 1) =
               *(ushort *)((long)&pRightTab->szTabRow + 1) & 0xfbff | 0x400;
          *(ushort *)((long)&pRightTab->szTabRow + 1) =
               *(ushort *)((long)&pRightTab->szTabRow + 1) & 0xefff | 0x1000;
          (pRightTab->u).tab.pFKey = (FKey *)zName;
        }
        if (*(int *)&p_local->pWhere != 0) {
          return 1;
        }
      }
      if ((*(ushort *)((long)&pRightTab->szTabRow + 1) >> 10 & 1) == 0) {
        if ((pRightTab->u).tab.pFKey != (FKey *)0x0) {
          sqlite3SetJoinExpr((Expr *)(pRightTab->u).tab.pFKey,(pRightTab->u).tab.addColOffset,
                             pUsing._4_4_);
          pSVar4 = (Select *)
                   sqlite3ExprAnd((Parse *)p_local,(Expr *)pSrc->a[0].pSelect,
                                  (Expr *)(pRightTab->u).tab.pFKey);
          pSrc->a[0].pSelect = pSVar4;
          (pRightTab->u).tab.pFKey = (FKey *)0x0;
          *(ushort *)((long)&pRightTab->szTabRow + 1) =
               *(ushort *)((long)&pRightTab->szTabRow + 1) & 0xf7ff | 0x800;
        }
      }
      else {
        db = (sqlite3 *)(pRightTab->u).tab.pFKey;
        zName_1 = *(char **)p_local;
        for (pLeft._0_4_ = 0; (int)pLeft < *(int *)&db->pVfs; pLeft._0_4_ = (int)pLeft + 1) {
          _iLeftCol = *(char **)(db->aLimit + (long)(int)pLeft * 4 + -0x20);
          iVar1 = sqlite3ColumnIndex(pTStack_48,_iLeftCol);
          if ((iVar1 < 0) ||
             (iVar2 = tableAndColumnIndex(_j,0,pLeft._4_4_,_iLeftCol,&iRightCol,&local_80,
                                          (uint)(*(ushort *)((long)&pRightTab->szTabRow + 1) >> 0xc
                                                & 1)), iVar2 == 0)) {
            sqlite3ErrorMsg((Parse *)p_local,
                            "cannot join using column %s - column not present in both tables",
                            _iLeftCol);
            return 1;
          }
          pE2 = sqlite3CreateColumnExpr((sqlite3 *)zName_1,_j,iRightCol,local_80);
          sqlite3SrcItemColumnUsed(_j->a + iRightCol,local_80);
          if ((_j->a[0].fg.jointype & 0x40) != 0) {
            local_a8 = (ExprList *)0x0;
            while (iVar2 = tableAndColumnIndex(_j,iRightCol + 1,pLeft._4_4_,_iLeftCol,&iRightCol,
                                               &local_80,
                                               (uint)(*(ushort *)((long)&pRightTab->szTabRow + 1) >>
                                                      0xc & 1)), iVar2 != 0) {
              if (((*(ushort *)&_j->a[iRightCol].fg.field_0x1 >> 10 & 1) == 0) ||
                 (iVar2 = sqlite3IdListIndex(_j->a[iRightCol].u3.pUsing,_iLeftCol), iVar2 < 0)) {
                sqlite3ErrorMsg((Parse *)p_local,"ambiguous reference to %s in USING()",_iLeftCol);
                break;
              }
              local_a8 = sqlite3ExprListAppend((Parse *)p_local,local_a8,pE2);
              pE2 = sqlite3CreateColumnExpr((sqlite3 *)zName_1,_j,iRightCol,local_80);
              sqlite3SrcItemColumnUsed(_j->a + iRightCol,local_80);
            }
            if (local_a8 != (ExprList *)0x0) {
              pList_00 = sqlite3ExprListAppend((Parse *)p_local,local_a8,pE2);
              pE2 = sqlite3ExprFunction((Parse *)p_local,pList_00,&sqlite3ProcessJoin::tkCoalesce,0)
              ;
            }
          }
          pRight_00 = sqlite3CreateColumnExpr((sqlite3 *)zName_1,_j,pLeft._4_4_ + 1,iVar1);
          sqlite3SrcItemColumnUsed((SrcItem *)pRightTab,iVar1);
          pRight_01 = sqlite3PExpr((Parse *)p_local,0x35,pE2,pRight_00);
          if (pRight_01 != (Expr *)0x0) {
            pRight_01->flags = pUsing._4_4_ | pRight_01->flags;
            pRight_01->w = (anon_union_4_2_009eaf8f_for_w)pRight_00->iTable;
          }
          pSVar4 = (Select *)sqlite3ExprAnd((Parse *)p_local,(Expr *)pSrc->a[0].pSelect,pRight_01);
          pSrc->a[0].pSelect = pSVar4;
        }
      }
    }
    pLeft._4_4_ = pLeft._4_4_ + 1;
    pRightTab = pRightTab + 1;
    pRight = pRight + 1;
  } while( true );
}

Assistant:

static int sqlite3ProcessJoin(Parse *pParse, Select *p){
  SrcList *pSrc;                  /* All tables in the FROM clause */
  int i, j;                       /* Loop counters */
  SrcItem *pLeft;                 /* Left table being joined */
  SrcItem *pRight;                /* Right table being joined */

  pSrc = p->pSrc;
  pLeft = &pSrc->a[0];
  pRight = &pLeft[1];
  for(i=0; i<pSrc->nSrc-1; i++, pRight++, pLeft++){
    Table *pRightTab = pRight->pTab;
    u32 joinType;

    if( NEVER(pLeft->pTab==0 || pRightTab==0) ) continue;
    joinType = (pRight->fg.jointype & JT_OUTER)!=0 ? EP_OuterON : EP_InnerON;

    /* If this is a NATURAL join, synthesize an approprate USING clause
    ** to specify which columns should be joined.
    */
    if( pRight->fg.jointype & JT_NATURAL ){
      IdList *pUsing = 0;
      if( pRight->fg.isUsing || pRight->u3.pOn ){
        sqlite3ErrorMsg(pParse, "a NATURAL join may not have "
           "an ON or USING clause", 0);
        return 1;
      }
      for(j=0; j<pRightTab->nCol; j++){
        char *zName;   /* Name of column in the right table */

        if( IsHiddenColumn(&pRightTab->aCol[j]) ) continue;
        zName = pRightTab->aCol[j].zCnName;
        if( tableAndColumnIndex(pSrc, 0, i, zName, 0, 0, 1) ){
          pUsing = sqlite3IdListAppend(pParse, pUsing, 0);
          if( pUsing ){
            assert( pUsing->nId>0 );
            assert( pUsing->a[pUsing->nId-1].zName==0 );
            pUsing->a[pUsing->nId-1].zName = sqlite3DbStrDup(pParse->db, zName);
          }
        }
      }
      if( pUsing ){
        pRight->fg.isUsing = 1;
        pRight->fg.isSynthUsing = 1;
        pRight->u3.pUsing = pUsing;
      }
      if( pParse->nErr ) return 1;
    }

    /* Create extra terms on the WHERE clause for each column named
    ** in the USING clause.  Example: If the two tables to be joined are
    ** A and B and the USING clause names X, Y, and Z, then add this
    ** to the WHERE clause:    A.X=B.X AND A.Y=B.Y AND A.Z=B.Z
    ** Report an error if any column mentioned in the USING clause is
    ** not contained in both tables to be joined.
    */
    if( pRight->fg.isUsing ){
      IdList *pList = pRight->u3.pUsing;
      sqlite3 *db = pParse->db;
      assert( pList!=0 );
      for(j=0; j<pList->nId; j++){
        char *zName;     /* Name of the term in the USING clause */
        int iLeft;       /* Table on the left with matching column name */
        int iLeftCol;    /* Column number of matching column on the left */
        int iRightCol;   /* Column number of matching column on the right */
        Expr *pE1;       /* Reference to the column on the LEFT of the join */
        Expr *pE2;       /* Reference to the column on the RIGHT of the join */
        Expr *pEq;       /* Equality constraint.  pE1 == pE2 */

        zName = pList->a[j].zName;
        iRightCol = sqlite3ColumnIndex(pRightTab, zName);
        if( iRightCol<0
         || tableAndColumnIndex(pSrc, 0, i, zName, &iLeft, &iLeftCol,
                                pRight->fg.isSynthUsing)==0
        ){
          sqlite3ErrorMsg(pParse, "cannot join using column %s - column "
            "not present in both tables", zName);
          return 1;
        }
        pE1 = sqlite3CreateColumnExpr(db, pSrc, iLeft, iLeftCol);
        sqlite3SrcItemColumnUsed(&pSrc->a[iLeft], iLeftCol);
        if( (pSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
          /* This branch runs if the query contains one or more RIGHT or FULL
          ** JOINs.  If only a single table on the left side of this join
          ** contains the zName column, then this branch is a no-op.
          ** But if there are two or more tables on the left side
          ** of the join, construct a coalesce() function that gathers all
          ** such tables.  Raise an error if more than one of those references
          ** to zName is not also within a prior USING clause.
          **
          ** We really ought to raise an error if there are two or more
          ** non-USING references to zName on the left of an INNER or LEFT
          ** JOIN.  But older versions of SQLite do not do that, so we avoid
          ** adding a new error so as to not break legacy applications.
          */
          ExprList *pFuncArgs = 0;   /* Arguments to the coalesce() */
          static const Token tkCoalesce = { "coalesce", 8 };
          while( tableAndColumnIndex(pSrc, iLeft+1, i, zName, &iLeft, &iLeftCol,
                                     pRight->fg.isSynthUsing)!=0 ){
            if( pSrc->a[iLeft].fg.isUsing==0
             || sqlite3IdListIndex(pSrc->a[iLeft].u3.pUsing, zName)<0
            ){
              sqlite3ErrorMsg(pParse, "ambiguous reference to %s in USING()",
                              zName);
              break;
            }
            pFuncArgs = sqlite3ExprListAppend(pParse, pFuncArgs, pE1);
            pE1 = sqlite3CreateColumnExpr(db, pSrc, iLeft, iLeftCol);
            sqlite3SrcItemColumnUsed(&pSrc->a[iLeft], iLeftCol);
          }
          if( pFuncArgs ){
            pFuncArgs = sqlite3ExprListAppend(pParse, pFuncArgs, pE1);
            pE1 = sqlite3ExprFunction(pParse, pFuncArgs, &tkCoalesce, 0);
          }
        }
        pE2 = sqlite3CreateColumnExpr(db, pSrc, i+1, iRightCol);
        sqlite3SrcItemColumnUsed(pRight, iRightCol);
        pEq = sqlite3PExpr(pParse, TK_EQ, pE1, pE2);
        assert( pE2!=0 || pEq==0 );
        if( pEq ){
          ExprSetProperty(pEq, joinType);
          assert( !ExprHasProperty(pEq, EP_TokenOnly|EP_Reduced) );
          ExprSetVVAProperty(pEq, EP_NoReduce);
          pEq->w.iJoin = pE2->iTable;
        }
        p->pWhere = sqlite3ExprAnd(pParse, p->pWhere, pEq);
      }
    }

    /* Add the ON clause to the end of the WHERE clause, connected by
    ** an AND operator.
    */
    else if( pRight->u3.pOn ){
      sqlite3SetJoinExpr(pRight->u3.pOn, pRight->iCursor, joinType);
      p->pWhere = sqlite3ExprAnd(pParse, p->pWhere, pRight->u3.pOn);
      pRight->u3.pOn = 0;
      pRight->fg.isOn = 1;
    }
  }
  return 0;
}